

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

UniValue * __thiscall
RPCHelpMan::HandleRequest(UniValue *__return_storage_ptr__,RPCHelpMan *this,JSONRPCRequest *request)

{
  string key;
  UniValue val;
  UniValue val_00;
  bool bVar1;
  int iVar2;
  UniValue *request_00;
  UniValue *pUVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer pRVar5;
  RPCArg *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  vector<UniValue,_std::allocator<UniValue>_> *this_01;
  RPCResult *this_02;
  long lVar6;
  pointer pcVar7;
  long in_FS_OFFSET;
  UniValue *ret;
  UniValue match_1;
  UniValue match;
  UniValue arg_mismatch;
  undefined8 in_stack_fffffffffffffd38;
  char (*in_stack_fffffffffffffd40) [42];
  RPCResult *pRVar8;
  RPCHelpMan *fmt;
  string *in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd70 [32];
  string in_stack_fffffffffffffd90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<UniValue,_std::allocator<UniValue>_> local_210;
  undefined1 local_1f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  vector<UniValue,_std::allocator<UniValue>_> local_1b8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [9];
  undefined4 local_187;
  undefined2 local_183;
  char local_181;
  VType local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  vector<UniValue,_std::allocator<UniValue>_> local_140;
  string local_128;
  undefined1 local_108 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<UniValue,_std::allocator<UniValue>_> vStack_c8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  undefined1 local_90 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<UniValue,_std::allocator<UniValue>_> vStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (request->mode == GET_ARGS) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      GetArgMap(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    goto LAB_006e9d07;
  }
  if ((request->mode == GET_HELP) ||
     (bVar1 = IsValidNumArgs(this,((long)(request->params).values.
                                         super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(request->params).values.
                                         super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 3) *
                                  0x2e8ba2e8ba2e8ba3), !bVar1)) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    ToString_abi_cxx11_((string *)local_90,this);
    std::runtime_error::runtime_error(prVar4,(string *)local_90);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_006e9d07;
  }
  local_b0 = local_a0;
  local_90._8_8_ = &local_78;
  local_90._0_4_ = VOBJ;
  local_78._M_local_buf[0] = '\0';
  local_78._1_7_ = (undefined7)local_a0._1_8_;
  local_78._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_78._9_4_ = local_97;
  local_78._13_2_ = local_93;
  local_78._M_local_buf[0xf] = local_91;
  local_90._16_8_ = 0;
  local_a8 = 0;
  local_a0[0] = 0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pRVar5 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar5) {
    pUVar3 = &request->params;
    lVar6 = 0;
    pcVar7 = (pointer)0x1;
    do {
      request_00 = ::UniValue::operator[](pUVar3,(size_t)(pcVar7 + -1));
      this_00 = (RPCArg *)((long)&(pRVar5->m_names)._M_dataplus._M_p + lVar6);
      ::RPCArg::MatchesType((UniValue *)local_108,this_00,request_00);
      if ((local_108._0_4_ != VBOOL) ||
         (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_108 + 8),"1"), iVar2 != 0)) {
        local_1f8._0_8_ = pcVar7;
        tinyformat::format<unsigned_long,std::__cxx11::string>
                  (&local_128,(tinyformat *)"Position %s (%s)",local_1f8,(unsigned_long *)this_00,
                   in_R8);
        local_180 = local_108._0_4_;
        local_178 = &local_168;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._8_8_ != &local_f0) {
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._8_8_;
        }
        local_168._M_allocated_capacity._1_7_ = local_f0._M_allocated_capacity._1_7_;
        local_168._M_local_buf[0] = local_f0._M_local_buf[0];
        local_170 = local_108._16_8_;
        local_108._16_8_ = 0;
        local_f0._M_local_buf[0] = '\0';
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_e0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start =
             vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish =
             vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_140.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key._M_string_length = (size_type)in_stack_fffffffffffffd40;
        key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd38;
        key.field_2._M_allocated_capacity = (size_type)__return_storage_ptr__;
        key.field_2._8_8_ = request;
        val_00.val._M_dataplus._M_p = (pointer)this;
        val_00._0_8_ = pUVar3;
        val_00.val._M_string_length = (size_type)in_stack_fffffffffffffd68;
        val_00.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )in_stack_fffffffffffffd70._0_16_;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70._16_8_;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd70._24_8_;
        val_00._56_32_ = in_stack_fffffffffffffd90;
        local_108._8_8_ = &local_f0;
        ::UniValue::pushKV((UniValue *)local_90,key,val_00);
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_140);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_158);
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._8_8_ != &local_f0) {
        operator_delete((void *)local_108._8_8_,
                        CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1)
        ;
      }
      pRVar5 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x108;
      bVar1 = pcVar7 < (pointer)(((long)(this->m_args).
                                        super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pRVar5 >> 3) *
                                0xf83e0f83e0f83e1);
      pcVar7 = pcVar7 + 1;
    } while (bVar1);
    if (vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_50.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      ::UniValue::write_abi_cxx11_((UniValue *)local_1f8,(int)local_90,(void *)0x4,0);
      tinyformat::format<std::__cxx11::string>
                ((string *)local_108,(tinyformat *)"Wrong type passed:\n%s",local_1f8,args);
      JSONRPCError(pUVar3,-3,(string *)local_108);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar3,&::UniValue::typeinfo,::UniValue::~UniValue);
      }
      goto LAB_006e9d07;
    }
  }
  this_01 = &vStack_50;
  local_108[0] = this->m_req == (JSONRPCRequest *)0x0;
  fmt = this;
  inline_check_non_fatal<bool>
            ((bool *)local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
             ,0x298,"HandleRequest","m_req == nullptr");
  this->m_req = request;
  if ((this->m_fun).super__Function_base._M_manager == (_Manager_type)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006e9d07;
    std::__throw_bad_function_call();
  }
  else {
    (*(this->m_fun)._M_invoker)(__return_storage_ptr__,(_Any_data *)&this->m_fun,this,request);
    this->m_req = (JSONRPCRequest *)0x0;
    local_108._0_8_ = local_108 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"-rpcdoccheck","");
    in_stack_fffffffffffffd68 = (string *)local_108;
    bVar1 = ArgsManager::GetBoolArg(&gArgs,in_stack_fffffffffffffd68,false);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if (!bVar1) {
LAB_006e97e8:
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(this_01);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._8_8_ != &local_78) {
        operator_delete((void *)local_90._8_8_,CONCAT71(local_78._1_7_,local_78._M_local_buf[0]) + 1
                       );
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_006e9d07;
    }
    local_1a0 = local_190;
    local_108._8_8_ = &local_f0;
    local_108._0_4_ = 2;
    local_f0._M_local_buf[0] = '\0';
    local_f0._M_allocated_capacity._1_7_ = (undefined7)local_190._1_8_;
    local_f0._M_local_buf[8] = SUB81(local_190._1_8_,7);
    local_f0._9_4_ = local_187;
    local_f0._13_2_ = local_183;
    local_f0._M_local_buf[0xf] = local_181;
    local_108._16_8_ = 0;
    local_198 = 0;
    local_190[0] = 0;
    local_e0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_02 = (this->m_results).m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pRVar8 = (this->m_results).m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_02 != pRVar8) {
      do {
        ::RPCResult::MatchesType((UniValue *)local_1f8,this_02,__return_storage_ptr__);
        if ((local_1f8._0_4_ == VBOOL) &&
           (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_1f8 + 8),"1"), iVar2 == 0)) {
          bVar1 = true;
          ::UniValue::setNull((UniValue *)local_108);
        }
        else {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._8_8_ == &local_1e0) {
            local_238._8_8_ = local_1e0._8_8_;
            local_248 = &local_238;
          }
          else {
            local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1f8._8_8_;
          }
          local_238._M_allocated_capacity._1_7_ = local_1e0._M_allocated_capacity._1_7_;
          local_238._M_local_buf[0] = local_1e0._M_local_buf[0];
          local_1f8._16_8_ = 0;
          local_1e0._M_local_buf[0] = '\0';
          local_228.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_1d0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_228.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_1d0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_228.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_1d0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1d0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1d0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_210.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_210.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_210.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1b8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          val.val._M_dataplus._M_p = *in_stack_fffffffffffffd40;
          val._0_8_ = in_stack_fffffffffffffd38;
          val.val._M_string_length = (size_type)__return_storage_ptr__;
          val.val.field_2._M_allocated_capacity = (size_type)this_01;
          val.val.field_2._8_8_ = pRVar8;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = &fmt->m_name;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffd68;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)in_stack_fffffffffffffd70._0_8_;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data =
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)
               (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffd70._8_24_;
          local_1f8._8_8_ = &local_1e0;
          ::UniValue::push_back((UniValue *)local_108,val);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_210);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_228);
          if (local_248 != &local_238) {
            operator_delete(local_248,local_238._M_allocated_capacity + 1);
          }
          bVar1 = false;
        }
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._8_8_ != &local_1e0) {
          operator_delete((void *)local_1f8._8_8_,
                          CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0])
                          + 1);
        }
        this_02 = this_02 + 1;
      } while (!bVar1 && this_02 != pRVar8);
      if (local_108._0_4_ == VNULL) {
        std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._8_8_ != &local_f0) {
          operator_delete((void *)local_108._8_8_,
                          CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) +
                          1);
        }
        goto LAB_006e97e8;
      }
    }
  }
  iVar2 = (int)in_stack_fffffffffffffd68;
  if (vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"no possible results defined","");
  }
  else {
    if ((long)vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)vStack_c8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start == 0x58) {
      pUVar3 = ::UniValue::operator[]((UniValue *)local_108,0);
      iVar2 = (int)pUVar3;
    }
    ::UniValue::write_abi_cxx11_((UniValue *)local_1f8,iVar2,(void *)0x4,0);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  FormatFullVersion_abi_cxx11_();
  tinyformat::
  format<std::__cxx11::string,std::__cxx11::string,char[13],std::__cxx11::string,char[42]>
            ((string *)&stack0xfffffffffffffd90,
             (tinyformat *)
             "Internal bug detected: RPC call \"%s\" returned incorrect type:\n%s\n%s %s\nPlease report this issue here: %s\n"
             ,(char *)fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bitcoin Core",
             (char (*) [13])&stack0xfffffffffffffd70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "https://github.com/bitcoin/bitcoin/issues",in_stack_fffffffffffffd40);
  std::runtime_error::runtime_error(prVar4,(string *)&stack0xfffffffffffffd90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_006e9d07:
  __stack_chk_fail();
}

Assistant:

UniValue RPCHelpMan::HandleRequest(const JSONRPCRequest& request) const
{
    if (request.mode == JSONRPCRequest::GET_ARGS) {
        return GetArgMap();
    }
    /*
     * Check if the given request is valid according to this command or if
     * the user is asking for help information, and throw help when appropriate.
     */
    if (request.mode == JSONRPCRequest::GET_HELP || !IsValidNumArgs(request.params.size())) {
        throw std::runtime_error(ToString());
    }
    UniValue arg_mismatch{UniValue::VOBJ};
    for (size_t i{0}; i < m_args.size(); ++i) {
        const auto& arg{m_args.at(i)};
        UniValue match{arg.MatchesType(request.params[i])};
        if (!match.isTrue()) {
            arg_mismatch.pushKV(strprintf("Position %s (%s)", i + 1, arg.m_names), std::move(match));
        }
    }
    if (!arg_mismatch.empty()) {
        throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Wrong type passed:\n%s", arg_mismatch.write(4)));
    }
    CHECK_NONFATAL(m_req == nullptr);
    m_req = &request;
    UniValue ret = m_fun(*this, request);
    m_req = nullptr;
    if (gArgs.GetBoolArg("-rpcdoccheck", DEFAULT_RPC_DOC_CHECK)) {
        UniValue mismatch{UniValue::VARR};
        for (const auto& res : m_results.m_results) {
            UniValue match{res.MatchesType(ret)};
            if (match.isTrue()) {
                mismatch.setNull();
                break;
            }
            mismatch.push_back(std::move(match));
        }
        if (!mismatch.isNull()) {
            std::string explain{
                mismatch.empty() ? "no possible results defined" :
                mismatch.size() == 1 ? mismatch[0].write(4) :
                mismatch.write(4)};
            throw std::runtime_error{
                strprintf("Internal bug detected: RPC call \"%s\" returned incorrect type:\n%s\n%s %s\nPlease report this issue here: %s\n",
                          m_name, explain,
                          PACKAGE_NAME, FormatFullVersion(),
                          PACKAGE_BUGREPORT)};
        }
    }
    return ret;
}